

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sha1.cpp
# Opt level: O2

void __thiscall ON_SHA1::AccumulateBoundingBox(ON_SHA1 *this,ON_BoundingBox *bbox)

{
  bool bVar1;
  
  bVar1 = ON_BoundingBox::IsSet(bbox);
  if (!bVar1) {
    bbox = &ON_BoundingBox::UnsetBoundingBox;
  }
  Accumulate3dPoint(this,&bbox->m_min);
  Accumulate3dPoint(this,&bbox->m_max);
  return;
}

Assistant:

void ON_SHA1::AccumulateBoundingBox(
  const class ON_BoundingBox& bbox
)
{
  if (bbox.IsSet())
  {
    Accumulate3dPoint(bbox.m_min);
    Accumulate3dPoint(bbox.m_max);
  }
  else
  {
    Accumulate3dPoint(ON_BoundingBox::UnsetBoundingBox.m_min);
    Accumulate3dPoint(ON_BoundingBox::UnsetBoundingBox.m_max);
  }
}